

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessageTest_TestToString_Test::TestBody
          (DataDictionaryMessageTest_TestToString_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  internal local_18 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10;
  
  bidfx_public_api::price::pixie::DataDictionaryMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[697],std::__cxx11::string>
            (local_18,
             "\"DataDictionary(update=false, fields=[\\n\" \"  fieldDef(FID=0, name=\\\"Bid\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=1, name=\\\"Ask\\\", type=DOUBLE, encoding=VARINT, scale=6)\\n\" \"  fieldDef(FID=2, name=\\\"BidSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=3, name=\\\"AskSize\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=4, name=\\\"BidTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=5, name=\\\"AskTime\\\", type=LONG, encoding=VARINT, scale=0)\\n\" \"  fieldDef(FID=6, name=\\\"OrderQuantity\\\", type=DOUBLE, encoding=VARINT, scale=2)\\n\" \"  fieldDef(FID=9, name=\\\"NetChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=4)\\n\" \"  fieldDef(FID=10, name=\\\"PercentChange\\\", type=DOUBLE, encoding=ZIGZAG, scale=2)\\n\" \"])\""
             ,"data_dict_message->ToString()",
             (char (*) [697])
             "DataDictionary(update=false, fields=[\n  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n])"
             ,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_18[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_38);
    if (local_10.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_10.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/data_dictionary_message_test.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_38._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_38._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_38._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(DataDictionaryMessageTest, TestToString)
{
    ASSERT_EQ("DataDictionary(update=false, fields=[\n"
                 "  fieldDef(FID=0, name=\"Bid\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=1, name=\"Ask\", type=DOUBLE, encoding=VARINT, scale=6)\n"
                 "  fieldDef(FID=2, name=\"BidSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=3, name=\"AskSize\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=4, name=\"BidTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=5, name=\"AskTime\", type=LONG, encoding=VARINT, scale=0)\n"
                 "  fieldDef(FID=6, name=\"OrderQuantity\", type=DOUBLE, encoding=VARINT, scale=2)\n"
                 "  fieldDef(FID=9, name=\"NetChange\", type=DOUBLE, encoding=ZIGZAG, scale=4)\n"
                 "  fieldDef(FID=10, name=\"PercentChange\", type=DOUBLE, encoding=ZIGZAG, scale=2)\n"
                 "])", data_dict_message->ToString());
}